

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBuffer.c
# Opt level: O2

JL_STATUS JlBufferFree(JlBuffer **pBufferContext)

{
  JL_STATUS JVar1;
  
  JVar1 = JL_STATUS_INVALID_PARAMETER;
  if ((pBufferContext != (JlBuffer **)0x0) && (*pBufferContext != (JlBuffer *)0x0)) {
    WjTestLib_Free((*pBufferContext)->Buffer);
    WjTestLib_Free(*pBufferContext);
    *pBufferContext = (JlBuffer *)0x0;
    JVar1 = JL_STATUS_SUCCESS;
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlBufferFree
    (
        JlBuffer**      pBufferContext
    )
{
    JL_STATUS jlStatus;

    if(     NULL != pBufferContext
        &&  NULL != *pBufferContext )
    {
        JlFree( (*pBufferContext)->Buffer );
        JlFree( *pBufferContext );
        *pBufferContext = NULL;

        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}